

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O0

Orphan<capnp::Text> * __thiscall
capnp::_::anon_unknown_0::PrefixAdder::decode
          (Orphan<capnp::Text> *__return_storage_ptr__,PrefixAdder *this,JsonCodec *codec,
          Reader input,Orphanage orphanage)

{
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  JsonCodec *local_30;
  JsonCodec *codec_local;
  PrefixAdder *this_local;
  Orphanage orphanage_local;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (PrefixAdder *)orphanage.arena;
  local_30 = codec;
  codec_local = (JsonCodec *)this;
  orphanage_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  local_60 = (ArrayPtr<const_char>)capnp::json::Value::Reader::getString(&input);
  local_50 = (ArrayPtr<const_char>)kj::StringPtr::slice((StringPtr *)&local_60,0xb);
  Text::Reader::Reader((Reader *)&local_40,(StringPtr *)&local_50);
  Orphanage::newOrphanCopy<capnp::Text::Reader>
            (__return_storage_ptr__,(Orphanage *)&this_local,(Reader)local_40);
  return __return_storage_ptr__;
}

Assistant:

Orphan<capnp::Text> decode(const JsonCodec& codec, JsonValue::Reader input,
                             Orphanage orphanage) const override {
    return orphanage.newOrphanCopy(capnp::Text::Reader(input.getString().slice(11)));
  }